

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::EAMAdapter::getOrhoE
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,EAMAdapter *this)

{
  ZhouParameters zhouParam;
  ZhouParameters ZStack_118;
  
  getZhouParam(&ZStack_118,this);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,&ZStack_118.OrhoE);
  ZhouParameters::~ZhouParameters(&ZStack_118);
  return __return_storage_ptr__;
}

Assistant:

std::vector<RealType> EAMAdapter::getOrhoE() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.OrhoE;
  }